

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_scriptutil.cpp
# Opt level: O0

void __thiscall
ScriptUtil_GetP2pkhLockingScriptTest_Test::ScriptUtil_GetP2pkhLockingScriptTest_Test
          (ScriptUtil_GetP2pkhLockingScriptTest_Test *this)

{
  ScriptUtil_GetP2pkhLockingScriptTest_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test =
       (_func_int **)&PTR__ScriptUtil_GetP2pkhLockingScriptTest_Test_0088e188;
  return;
}

Assistant:

TEST(ScriptUtil, GetP2pkhLockingScriptTest) {
  const std::vector<ScriptUtil_PubkeyTestVector> test_vectors = {
    {
      Pubkey("02522952c3fc2a53a8651b08ce10988b7506a3b40a5c26f9648a911be33e73e1a0"),
      Script("76a914edaf2414751239b72b653ea004adc310a3522e3788ac")
    },
    {
      Pubkey("0340b52ae45bc1be5de083f1730fe537374e219c4836400623741d2a874e60590c"),
      Script("76a91449a011f97ba520dab063f309bad59daeb30de10188ac")
    },
    {
      Pubkey("04fe53c78e36b86aae8082484a4007b706d5678cabb92d178fc95020d4d8dc41ef44cfbb8dfa7a593c7910a5b6f94d079061a7766cbeed73e24ee4f654f1e51904"),
      Script("76a9148c1c7f335f5db8ae4e01615edb14844213ead72588ac")
    },
  };

  Script actual;
  for (const ScriptUtil_PubkeyTestVector& test_vector : test_vectors) {
    EXPECT_NO_THROW((actual = ScriptUtil::CreateP2pkhLockingScript(test_vector.input_pubkey)));
    EXPECT_STREQ(actual.GetHex().c_str(), test_vector.expect_locking_script.GetHex().c_str());
    ByteData160 pubkey_hash = HashUtil::Hash160(test_vector.input_pubkey);
    EXPECT_NO_THROW((actual = ScriptUtil::CreateP2pkhLockingScript(pubkey_hash)));
    EXPECT_STREQ(actual.GetHex().c_str(), test_vector.expect_locking_script.GetHex().c_str());
  }
}